

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_get_show_frame_flag(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar2 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar2 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar2 + 1;
  }
  if ((undefined4 *)*puVar2 != (undefined4 *)0x0) {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      *(undefined4 *)*puVar2 = *(undefined4 *)(*ctx->frame_worker->data1 + 0x3d40);
      return AOM_CODEC_OK;
    }
    return AOM_CODEC_ERROR;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_show_frame_flag(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  FrameWorkerData *const frame_worker_data =
      (FrameWorkerData *)ctx->frame_worker->data1;
  *arg = frame_worker_data->pbi->common.show_frame;
  return AOM_CODEC_OK;
}